

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_e9cea::StringFixture::convert
          (string *__return_storage_ptr__,StringFixture *this,string *source)

{
  string local_70;
  string local_50;
  string *local_20;
  string *source_local;
  StringFixture *this_local;
  
  local_20 = source;
  source_local = (string *)this;
  this_local = (StringFixture *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_70,(string *)source);
  pstore::dump::string::string(&local_50,&local_70,false);
  (anonymous_namespace)::StringFixture::convert_abi_cxx11_(__return_storage_ptr__,this,&local_50);
  pstore::dump::string::~string(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFixture::convert (std::string const & source) const {
        return this->convert (::pstore::dump::string{source});
    }